

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBValueCast_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  Type type;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  undefined6 uVar4;
  bool bVar5;
  undefined8 in_stack_ffffffffffffff88;
  allocator<char> local_41;
  undefined8 local_40;
  StructDef *local_38;
  EnumDef *local_30;
  undefined8 local_28;
  FieldDef *local_20;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  bVar5 = IsUnsigned((field->value).type.base_type);
  if (bVar5) {
    local_40._0_4_ = (local_20->value).type.base_type;
    local_40._4_4_ = (local_20->value).type.element;
    local_38 = (local_20->value).type.struct_def;
    local_30 = (local_20->value).type.enum_def;
    local_28 = *(undefined8 *)&(local_20->value).type.fixed_length;
    uVar1 = (local_20->value).type.struct_def;
    uVar2 = (local_20->value).type.enum_def;
    uVar3 = (local_20->value).type.fixed_length;
    uVar4 = *(undefined6 *)&(local_20->value).type.field_0x1a;
    type.enum_def._2_6_ = uVar4;
    type.enum_def._0_2_ = uVar3;
    type.struct_def = (StructDef *)uVar2;
    type._0_8_ = uVar1;
    type._24_8_ = in_stack_ffffffffffffff88;
    CastToSigned_abi_cxx11_(type);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBValueCast(const FieldDef &field) const {
    if (IsUnsigned(field.value.type.base_type)) {
      return CastToSigned(field.value.type);
    }
    return "";
  }